

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

string * getFileLines(string *__return_storage_ptr__,string *filename,long lineStart,
                     size_t lineCount)

{
  string *psVar1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  long lVar5;
  string line;
  stringstream rtn;
  ifstream file;
  char *local_3e8;
  long local_3e0;
  char local_3d8;
  undefined7 uStack_3d7;
  string *local_3c8;
  stringstream local_3c0 [16];
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(string *)filename,_S_in);
  std::istream::seekg((istream *)local_238,0,0);
  if (1 < lineStart) {
    lVar5 = lineStart + -1;
    do {
      std::istream::ignore((long)local_238,-1);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  local_3c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_3c0);
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = '\0';
  if (lineStart < 0x7ffffffffffffff6) {
    lVar5 = 0;
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_3e8,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        poVar4 = std::ostream::_M_insert<long>((long)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t|",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3e8,local_3e0);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 10);
  }
  psVar1 = local_3c8;
  std::__cxx11::stringbuf::str();
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return psVar1;
}

Assistant:

static std::string getFileLines(const std::string& filename, long lineStart,
                                size_t lineCount)
{
  std::ifstream file(filename);
  file.seekg(std::ios::beg);
  for (int i = 0; i < lineStart - 1; ++i) {
    file.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
  }
  std::stringstream rtn;
  std::string line;
  for (auto i = lineStart; i < (long)(lineStart + lineCount); i++) {
    if (std::getline(file, line)) {
      rtn << i << "\t|" << line << std::endl;
    }
  }

  return rtn.str();
}